

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameterization.cpp
# Opt level: O0

void __thiscall Parameterization::PrintPlot3DHeader(Parameterization *this,ofstream *outfile)

{
  ostream *poVar1;
  ofstream *outfile_local;
  Parameterization *this_local;
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)outfile,this->Gmax);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  this->G = 0;
  while (this->G < this->Gmax) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)outfile,this->Jmax);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->Kmax);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->Lmax);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    this->G = this->G + 1;
  }
  return;
}

Assistant:

void Parameterization::PrintPlot3DHeader(ofstream& outfile) {
  outfile << Gmax << endl;
  for (G = 0; G < Gmax; G++) {
    outfile << Jmax << " " << Kmax << " " << Lmax << endl;
  }
}